

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O0

bool __thiscall BasePort::ReadAllBoards(BasePort *this)

{
  uchar *puVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ostream *poVar8;
  void *this_00;
  bool ret;
  quadlet_t *readBuffer;
  uint board;
  bool rtRead;
  bool noneRead;
  bool allOK;
  allocator<char> local_39;
  string local_38 [32];
  BasePort *local_18;
  BasePort *this_local;
  
  local_18 = this;
  uVar4 = (*this->_vptr_BasePort[0x11])();
  if ((uVar4 & 1) == 0) {
    poVar8 = std::operator<<(this->outStr,"BasePort::ReadAllBoards: port not initialized");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    (*this->_vptr_BasePort[8])();
    this_local._7_1_ = false;
  }
  else if (this->Protocol_ == PROTOCOL_BC_QRW) {
    iVar5 = (*this->_vptr_BasePort[0x1e])();
    this_local._7_1_ = (bool)((byte)iVar5 & 1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_38,"ReadAllBoards",&local_39);
    iVar5 = (*this->_vptr_BasePort[0x1b])(this,local_38,(ulong)(this->autoReScan & 1));
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
    if ((((byte)iVar5 ^ 0xff) & 1) == 0) {
      bVar2 = true;
      bVar3 = true;
      for (readBuffer._4_4_ = 0; readBuffer._4_4_ < this->max_board;
          readBuffer._4_4_ = readBuffer._4_4_ + 1) {
        if (this->BoardList[readBuffer._4_4_] != (BoardIO *)0x0) {
          puVar1 = this->ReadBufferBroadcast;
          uVar4 = (*this->_vptr_BasePort[0x18])();
          uVar6 = (*this->_vptr_BasePort[0x14])(this,4);
          uVar7 = (*this->BoardList[readBuffer._4_4_]->_vptr_BoardIO[1])();
          uVar7 = (*this->_vptr_BasePort[0x26])
                            (this,(ulong)(byte)readBuffer._4_4_,0,
                             puVar1 + (ulong)uVar6 + (ulong)uVar4,(ulong)uVar7);
          if ((uVar7 & 1) == 0) {
            bVar2 = false;
          }
          else {
            (*this->BoardList[readBuffer._4_4_]->_vptr_BoardIO[2])
                      (this->BoardList[readBuffer._4_4_],puVar1 + (ulong)uVar6 + (ulong)uVar4);
            bVar3 = false;
          }
          BoardIO::SetReadValid(this->BoardList[readBuffer._4_4_],(bool)((byte)uVar7 & 1));
          if ((uVar7 & 1) == 0) {
            if (this->ReadErrorCounter_ == 0) {
              poVar8 = std::operator<<(this->outStr,"BasePort::ReadAllBoards: read failed on port ")
              ;
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->PortNum);
              poVar8 = std::operator<<(poVar8,", board ");
              this_00 = (void *)std::ostream::operator<<(poVar8,readBuffer._4_4_);
              std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            }
            this->ReadErrorCounter_ = this->ReadErrorCounter_ + 1;
            if (this->ReadErrorCounter_ == 10000) {
              poVar8 = std::operator<<(this->outStr,"BasePort::ReadAllBoards: read failed on port ")
              ;
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->PortNum);
              poVar8 = std::operator<<(poVar8,", board ");
              poVar8 = (ostream *)std::ostream::operator<<(poVar8,readBuffer._4_4_);
              poVar8 = std::operator<<(poVar8," occurred 10,000 times");
              std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
              this->ReadErrorCounter_ = 0;
            }
          }
          else {
            this->ReadErrorCounter_ = 0;
          }
        }
      }
      this_local._7_1_ = bVar2;
      if (bVar3) {
        (*this->_vptr_BasePort[8])();
      }
    }
    else {
      SetReadInvalid(this);
      (*this->_vptr_BasePort[8])();
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool BasePort::ReadAllBoards(void)
{
    if (!IsOK()) {
        outStr << "BasePort::ReadAllBoards: port not initialized" << std::endl;
        OnNoneRead();
        return false;
    }

    if (Protocol_ == BasePort::PROTOCOL_BC_QRW) {
        return ReadAllBoardsBroadcast();
    }

    if (!CheckFwBusGeneration("ReadAllBoards", autoReScan)) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    bool allOK = true;
    bool noneRead = true;

    bool rtRead = true;
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            quadlet_t *readBuffer = reinterpret_cast<quadlet_t *>(ReadBufferBroadcast + GetReadQuadAlign() + GetPrefixOffset(RD_FW_BDATA));
            bool ret = ReadBlock(board, 0, readBuffer, BoardList[board]->GetReadNumBytes());
            if (ret) {
                BoardList[board]->SetReadData(readBuffer);
                noneRead = false;
            } else {
                allOK = false;
            }
            BoardList[board]->SetReadValid(ret);

            if (ret) {
                ReadErrorCounter_ = 0;
            }
            else {
                if (ReadErrorCounter_ == 0) {
                    outStr << "BasePort::ReadAllBoards: read failed on port "
                           << PortNum << ", board " << board << std::endl;
                }
                ReadErrorCounter_++;
                if (ReadErrorCounter_ == 10000) {
                    outStr << "BasePort::ReadAllBoards: read failed on port "
                           << PortNum << ", board " << board << " occurred 10,000 times" << std::endl;
                    ReadErrorCounter_ = 0;
                }
            }
        }
    }
    if (!rtRead)
        outStr << "BasePort::ReadAllBoards: rtRead is false" << std::endl;

    if (noneRead) {
        OnNoneRead();
    }
    return allOK;
}